

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-mqtt.c
# Opt level: O2

int rops_handle_POLLIN_mqtt(lws_context_per_thread *pt,lws *wsi,pollfd *pollfd)

{
  short sVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  char *pcVar6;
  byte bVar7;
  lws_tokens ebuf;
  
  _lws_log(0x10,"%s: wsistate 0x%x, %s pollout %d\n","rops_handle_POLLIN_mqtt",(ulong)wsi->wsistate,
           wsi->protocol->name,(ulong)(uint)(int)pollfd->revents);
  ebuf.token = (uchar *)0x0;
  ebuf.len = 0;
  sVar1 = (short)wsi->wsistate;
  if (sVar1 == 0x119) {
    if (((pollfd->revents & 4) == 0) || (iVar2 = lws_handle_POLLOUT_event(wsi,pollfd), iVar2 == 0))
    {
      bVar7 = 0;
      uVar3 = 0;
LAB_00118b9a:
      sVar5 = lws_buflist_next_segment_len(&wsi->buflist,&ebuf.token);
      ebuf.len = (int)sVar5;
      if (ebuf.len == 0) {
        if ((pollfd->revents & pollfd->events & 1U) == 0) goto LAB_00118d7d;
        if (((byte)(wsi->wsistate >> 0x1c) & (short)wsi->wsistate != 0x119) == 0) {
          ebuf.token = pt->serv_buf;
          ebuf.len = wsi->context->pt_serv_buf_size;
          if (ebuf.len <= (int)uVar3) {
            uVar3 = ebuf.len;
          }
          if (uVar3 == 0) {
            uVar3 = ebuf.len;
          }
          ebuf.len = lws_ssl_capable_read(wsi,ebuf.token,uVar3);
          if (ebuf.len == 0xfffffffc) {
            _lws_log(8,"SSL Capable more service\n");
            goto LAB_00118d7d;
          }
          if (ebuf.len == 0xffffffff) {
            pcVar6 = "%s: LWS_SSL_CAPABLE_ERROR\n";
          }
          else {
            if (ebuf.len != 0) {
              ebuf.len = ebuf.len & 0x7fffffff;
              bVar7 = 0;
              goto LAB_00118c5c;
            }
            pcVar6 = "%s: zero length read\n";
          }
          _lws_log(8,pcVar6,"rops_handle_POLLIN_mqtt");
          goto LAB_00118b25;
        }
      }
      else {
        _lws_log(8,"draining buflist (len %d)\n",sVar5 & 0xffffffff);
        bVar7 = 1;
LAB_00118c5c:
        if (ebuf.len != 0) {
          uVar3 = lws_read_mqtt(wsi,ebuf.token,(long)ebuf.len);
          if ((int)uVar3 < 0) {
            _lws_log(4,"%s: lws_read_mqtt returned %d\n","rops_handle_POLLIN_mqtt",(ulong)uVar3);
            _lws_log(1,"%s: Failed, bailing\n","rops_handle_POLLIN_mqtt");
            lws_close_free_wsi(wsi,LWS_CLOSE_STATUS_NOSTATUS,"mqtt svc fail");
            return 4;
          }
          _lws_log(0x10,"%s: consuming %d / %d\n","rops_handle_POLLIN_mqtt",(ulong)uVar3,
                   (ulong)(uint)ebuf.len);
          iVar2 = lws_buflist_aware_finished_consuming
                            (wsi,&ebuf,ebuf.len,(uint)bVar7,"rops_handle_POLLIN_mqtt");
          if (iVar2 != 0) goto LAB_00118b25;
        }
      }
      ebuf.token = (uchar *)0x0;
      ebuf.len = 0;
      uVar4 = lws_ssl_pending(wsi);
      if (uVar4 != 0) {
        uVar3 = wsi->context->pt_serv_buf_size;
        if (uVar4 < uVar3) {
          uVar3 = uVar4;
        }
        goto LAB_00118b9a;
      }
      if ((bVar7 != 0) &&
         (sVar5 = lws_buflist_next_segment_len(&wsi->buflist,(uint8_t **)0x0), sVar5 == 0)) {
        _lws_log(8,"%s: %p flow buf: drained\n","rops_handle_POLLIN_mqtt",wsi);
        __lws_rx_flow_control(wsi);
      }
LAB_00118d7d:
      iVar2 = 5;
    }
    else {
      iVar2 = 6;
      if ((short)wsi->wsistate == 0x11c) {
        lwsi_set_state(wsi,0x11e);
      }
    }
  }
  else {
    if (((sVar1 == 0x204) && ((pollfd->revents & 4) != 0)) &&
       (iVar2 = lws_change_pollfd(wsi,4,0), iVar2 != 0)) {
      pcVar6 = "failed at set pollfd\n";
      iVar2 = 8;
    }
    else {
      if (((pollfd->revents & 4) == 0) || (iVar2 = lws_handle_POLLOUT_event(wsi,pollfd), iVar2 == 0)
         ) {
        iVar2 = lws_mqtt_client_socket_service(wsi,pollfd,(lws *)0x0);
        return (iVar2 == 0) + 4;
      }
      pcVar6 = "POLLOUT event closed it\n";
      iVar2 = 0x10;
    }
    _lws_log(iVar2,pcVar6);
LAB_00118b25:
    iVar2 = 6;
  }
  return iVar2;
}

Assistant:

static int
rops_handle_POLLIN_mqtt(struct lws_context_per_thread *pt, struct lws *wsi,
			   struct lws_pollfd *pollfd)
{
	unsigned int pending = 0;
	struct lws_tokens ebuf;
	int n = 0;
	char buffered = 0;

	lwsl_debug("%s: wsistate 0x%x, %s pollout %d\n", __func__,
		   (unsigned int)wsi->wsistate,  wsi->protocol->name,
		   pollfd->revents);

	/*
	 * After the CONNACK and nwsi establishment, the first logical
	 * stream is migrated out of the nwsi to be child sid 1, and the
	 * nwsi no longer has a wsi->mqtt of its own.
	 *
	 * RX events on the nwsi must be converted to events seen or not
	 * seen by one or more child streams.
	 *
	 * SUBACK - reflected to child stream that asked for it
	 * PUBACK - routed to child that did the related publish
	 */

	ebuf.token = NULL;
	ebuf.len = 0;

	if (lwsi_state(wsi) != LRS_ESTABLISHED) {
#if defined(LWS_WITH_CLIENT)

		if (lwsi_state(wsi) == LRS_WAITING_SSL &&
		    ((pollfd->revents & LWS_POLLOUT)) &&
		    lws_change_pollfd(wsi, LWS_POLLOUT, 0)) {
			lwsl_info("failed at set pollfd\n");
			return LWS_HPI_RET_PLEASE_CLOSE_ME;
		}

		if ((pollfd->revents & LWS_POLLOUT) &&
		    lws_handle_POLLOUT_event(wsi, pollfd)) {
			lwsl_debug("POLLOUT event closed it\n");
			return LWS_HPI_RET_PLEASE_CLOSE_ME;
		}

		n = lws_mqtt_client_socket_service(wsi, pollfd, NULL);
		if (n)
			return LWS_HPI_RET_WSI_ALREADY_DIED;
#endif
		return LWS_HPI_RET_HANDLED;
	}

	/* 1: something requested a callback when it was OK to write */

	if ((pollfd->revents & LWS_POLLOUT) &&
	    lwsi_state_can_handle_POLLOUT(wsi) &&
	    lws_handle_POLLOUT_event(wsi, pollfd)) {
		if (lwsi_state(wsi) == LRS_RETURNED_CLOSE)
			lwsi_set_state(wsi, LRS_FLUSHING_BEFORE_CLOSE);

		return LWS_HPI_RET_PLEASE_CLOSE_ME;
	}

	/* 3: buflist needs to be drained
	 */
read:
	// lws_buflist_describe(&wsi->buflist, wsi, __func__);
	ebuf.len = (int)lws_buflist_next_segment_len(&wsi->buflist, &ebuf.token);
	if (ebuf.len) {
		lwsl_info("draining buflist (len %d)\n", ebuf.len);
		buffered = 1;
		goto drain;
	}

	if (!(pollfd->revents & pollfd->events & LWS_POLLIN))
		return LWS_HPI_RET_HANDLED;

	/* if (lws_is_flowcontrolled(wsi)) { */
	/*	lwsl_info("%s: %p should be rxflow (bm 0x%x)..\n", */
	/*		    __func__, wsi, wsi->rxflow_bitmap); */
	/*	return LWS_HPI_RET_HANDLED; */
	/* } */

	if (!(lwsi_role_client(wsi) && lwsi_state(wsi) != LRS_ESTABLISHED)) {
		/*
		 * In case we are going to react to this rx by scheduling
		 * writes, we need to restrict the amount of rx to the size
		 * the protocol reported for rx buffer.
		 *
		 * Otherwise we get a situation we have to absorb possibly a
		 * lot of reads before we get a chance to drain them by writing
		 * them, eg, with echo type tests in autobahn.
		 */

		buffered = 0;
		ebuf.token = pt->serv_buf;
		ebuf.len = wsi->context->pt_serv_buf_size;

		if ((unsigned int)ebuf.len > wsi->context->pt_serv_buf_size)
			ebuf.len = wsi->context->pt_serv_buf_size;

		if ((int)pending > ebuf.len)
			pending = ebuf.len;

		ebuf.len = lws_ssl_capable_read(wsi, ebuf.token,
						pending ? (int)pending :
						ebuf.len);
		switch (ebuf.len) {
		case 0:
			lwsl_info("%s: zero length read\n",
				  __func__);
			return LWS_HPI_RET_PLEASE_CLOSE_ME;
		case LWS_SSL_CAPABLE_MORE_SERVICE:
			lwsl_info("SSL Capable more service\n");
			return LWS_HPI_RET_HANDLED;
		case LWS_SSL_CAPABLE_ERROR:
			lwsl_info("%s: LWS_SSL_CAPABLE_ERROR\n",
					__func__);
			return LWS_HPI_RET_PLEASE_CLOSE_ME;
		}

		/*
		 * coverity thinks ssl_capable_read() may read over
		 * 2GB.  Dissuade it...
		 */
		ebuf.len &= 0x7fffffff;
	}

drain:
	/* service incoming data */
	//lws_buflist_describe(&wsi->buflist, wsi, __func__);
	if (ebuf.len) {
		n = lws_read_mqtt(wsi, ebuf.token, ebuf.len);
		if (n < 0) {
			lwsl_notice("%s: lws_read_mqtt returned %d\n",
					__func__, n);
			/* we closed wsi */
			n = 0;
			goto fail;
                }
		// lws_buflist_describe(&wsi->buflist, wsi, __func__);
		lwsl_debug("%s: consuming %d / %d\n", __func__, n, ebuf.len);
		if (lws_buflist_aware_finished_consuming(wsi, &ebuf, ebuf.len,
							 buffered, __func__))
			return LWS_HPI_RET_PLEASE_CLOSE_ME;
	}

	ebuf.token = NULL;
	ebuf.len = 0;

	pending = lws_ssl_pending(wsi);
	if (pending) {
		pending = pending > wsi->context->pt_serv_buf_size ?
			wsi->context->pt_serv_buf_size : pending;
		goto read;
	}

	if (buffered && /* were draining, now nothing left */
	    !lws_buflist_next_segment_len(&wsi->buflist, NULL)) {
		lwsl_info("%s: %p flow buf: drained\n", __func__, wsi);
		/* having drained the rxflow buffer, can rearm POLLIN */
#if !defined(LWS_WITH_SERVER)
		n =
#endif
		__lws_rx_flow_control(wsi);
		/* n ignored, needed for NO_SERVER case */
	}

	/* n = 0 */
	return LWS_HPI_RET_HANDLED;

fail:
	lwsl_err("%s: Failed, bailing\n", __func__);
	lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS, "mqtt svc fail");

	return LWS_HPI_RET_WSI_ALREADY_DIED;
}